

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O1

void embree::sse42::InstanceArrayIntersector1MB::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  Vec3ff *pVVar1;
  ulong uVar2;
  undefined8 uVar3;
  int iVar4;
  Geometry *pGVar5;
  RTCRayQueryContext *pRVar6;
  long *plVar7;
  long lVar8;
  undefined1 auVar9 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  _func_int *p_Var17;
  undefined1 auVar18 [12];
  undefined1 in_XMM0 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar28;
  undefined1 in_XMM1 [16];
  vfloat4 a0;
  undefined1 auVar27 [16];
  undefined1 auVar29 [12];
  float fVar33;
  undefined1 in_XMM2 [16];
  undefined1 auVar30 [16];
  float fVar34;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 in_XMM3 [16];
  vfloat4 l02;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar42;
  undefined1 auVar43 [16];
  float fVar44;
  undefined1 auVar45 [12];
  undefined1 in_XMM5 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar50;
  undefined1 in_XMM6 [16];
  undefined1 auVar49 [16];
  float fVar51;
  undefined1 auVar54 [12];
  float fVar52;
  float fVar53;
  float fVar60;
  undefined1 in_XMM7 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar61;
  undefined1 auVar59 [16];
  float fVar62;
  undefined1 in_XMM8 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar66;
  undefined1 in_XMM9 [16];
  undefined1 auVar67 [16];
  float fVar68;
  undefined1 in_XMM10 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  undefined1 in_XMM14 [16];
  vfloat4 a0_1;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar88;
  float fVar89;
  RayQueryContext newcontext;
  undefined1 local_198 [8];
  undefined8 uStack_190;
  undefined1 local_188 [8];
  undefined8 uStack_180;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  float local_148;
  float local_c8;
  float local_78;
  float fStack_74;
  float fStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  undefined1 auVar26 [16];
  
  auVar54 = in_XMM7._0_12_;
  auVar45 = in_XMM5._0_12_;
  uVar14 = prim->primID_;
  pGVar5 = (context->scene->geometries).items[prim->instID_].ptr;
  p_Var17 = *(_func_int **)&pGVar5->field_0x58;
  if (p_Var17 == (_func_int *)0x0) {
    uVar12 = (ulong)*(uint *)(*(long *)&pGVar5[1].time_range.upper +
                             (long)pGVar5[1].intersectionFilterN * (ulong)uVar14);
    if (uVar12 == 0xffffffff) {
      p_Var17 = (_func_int *)0x0;
    }
    else {
      p_Var17 = pGVar5[1].super_RefCount._vptr_RefCount[uVar12];
    }
  }
  if (((p_Var17 != (_func_int *)0x0) && (((ray->super_RayK<1>).mask & pGVar5->mask) != 0)) &&
     (pRVar6 = context->user, pRVar6->instID[0] == 0xffffffff)) {
    pRVar6->instID[0] = prim->instID_;
    pRVar6->instPrimID[0] = uVar14;
    uVar12 = (ulong)prim->primID_;
    if (pGVar5->numTimeSteps == 1) {
      plVar7 = *(long **)&pGVar5[1].fnumTimeSegments;
      iVar4 = (int)plVar7[4];
      if ((pGVar5->field_8).field_0x1 == '\x01') {
        if (iVar4 == 0x9134) {
          lVar8 = *plVar7;
          lVar13 = uVar12 * plVar7[2];
          auVar22 = insertps(ZEXT416(*(uint *)(lVar8 + lVar13)),
                             *(undefined4 *)(lVar8 + 0x10 + lVar13),0x1c);
          in_XMM10 = insertps(auVar22,*(undefined4 *)(lVar8 + 0x20 + lVar13),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(lVar8 + 4 + lVar13)),
                             *(undefined4 *)(lVar8 + 0x14 + lVar13),0x1c);
          in_XMM4 = insertps(auVar22,*(undefined4 *)(lVar8 + 0x24 + lVar13),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(lVar8 + 8 + lVar13)),
                             *(undefined4 *)(lVar8 + 0x18 + lVar13),0x1c);
          in_XMM3 = insertps(auVar22,*(undefined4 *)(lVar8 + 0x28 + lVar13),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar13)),
                             *(undefined4 *)(lVar8 + 0x1c + lVar13),0x1c);
          in_XMM2 = insertps(auVar22,*(undefined4 *)(lVar8 + 0x2c + lVar13),0x28);
        }
        else if (iVar4 == 0x9234) {
          lVar8 = *plVar7;
          lVar13 = uVar12 * plVar7[2];
          uVar3 = *(undefined8 *)(lVar8 + 4 + lVar13);
          in_XMM10._4_4_ = (int)uVar3;
          in_XMM10._0_4_ = *(undefined4 *)(lVar8 + lVar13);
          in_XMM10._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM10._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x10 + lVar13);
          in_XMM4._4_4_ = (int)uVar3;
          in_XMM4._0_4_ = *(undefined4 *)(lVar8 + 0xc + lVar13);
          in_XMM4._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM4._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x1c + lVar13);
          in_XMM3._4_4_ = (int)uVar3;
          in_XMM3._0_4_ = *(undefined4 *)(lVar8 + 0x18 + lVar13);
          in_XMM3._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM3._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x28 + lVar13);
          in_XMM2._4_4_ = (int)uVar3;
          in_XMM2._0_4_ = *(undefined4 *)(lVar8 + 0x24 + lVar13);
          in_XMM2._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM2._12_4_ = 0;
        }
        else if (iVar4 == 0xb001) {
          lVar8 = *plVar7;
          lVar13 = uVar12 * plVar7[2];
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)(lVar8 + 0x10 + lVar13);
          auVar22 = insertps(auVar39,*(undefined4 *)(lVar8 + 8 + lVar13),0x20);
          uVar3 = *(undefined8 *)(lVar8 + 0x34 + lVar13);
          auVar69._4_4_ = (int)uVar3;
          auVar69._0_4_ = *(undefined4 *)(lVar8 + lVar13);
          auVar69._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar69._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x1c + lVar13);
          auVar32._4_4_ = (int)uVar3;
          auVar32._0_4_ = *(undefined4 *)(lVar8 + 0x18 + lVar13);
          auVar32._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar32._12_4_ = 0;
          fVar50 = *(float *)(lVar8 + 0x24 + lVar13);
          fVar24 = *(float *)(lVar8 + 0x28 + lVar13);
          fVar25 = *(float *)(lVar8 + 0x2c + lVar13);
          fVar28 = *(float *)(lVar8 + 0x30 + lVar13);
          fVar62 = fVar28 * fVar28 + fVar25 * fVar25 + fVar50 * fVar50 + fVar24 * fVar24;
          auVar86 = rsqrtss(ZEXT416((uint)fVar62),ZEXT416((uint)fVar62));
          fVar51 = auVar86._0_4_;
          auVar58._4_12_ = auVar86._4_12_;
          fVar51 = fVar51 * fVar51 * fVar62 * -0.5 * fVar51 + fVar51 * 1.5;
          in_XMM2 = insertps(auVar32,ZEXT416((uint)(fVar50 * fVar51)),0x30);
          in_XMM10 = insertps(auVar69,ZEXT416((uint)(fVar24 * fVar51)),0x30);
          auVar58._0_4_ = fVar51 * fVar28;
          auVar86 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar13)),
                             *(undefined4 *)(lVar8 + 4 + lVar13),0x10);
          in_XMM3 = insertps(auVar22,auVar58,0x30);
          auVar22 = insertps(auVar86,*(undefined4 *)(lVar8 + 0x3c + lVar13),0x20);
          in_XMM4 = insertps(auVar22,ZEXT416((uint)(fVar25 * fVar51)),0x30);
        }
        else if (iVar4 == 0x9244) {
          lVar8 = *plVar7;
          lVar13 = uVar12 * plVar7[2];
          in_XMM10 = *(undefined1 (*) [16])(lVar8 + lVar13);
          in_XMM4 = *(undefined1 (*) [16])(lVar8 + 0x10 + lVar13);
          in_XMM3 = *(undefined1 (*) [16])(lVar8 + 0x20 + lVar13);
          in_XMM2 = *(undefined1 (*) [16])(lVar8 + 0x30 + lVar13);
        }
        fVar62 = in_XMM2._8_4_;
        fVar50 = in_XMM2._12_4_;
        fVar34 = in_XMM10._12_4_;
        fVar33 = in_XMM4._4_4_;
        fVar28 = in_XMM4._12_4_;
        fVar76 = in_XMM3._8_4_;
        fVar25 = in_XMM3._12_4_;
        fVar68 = fVar34 * fVar28 + fVar25 * fVar50;
        fVar51 = fVar34 * fVar28 - fVar25 * fVar50;
        fVar52 = fVar50 * fVar50 + fVar34 * fVar34 + -fVar28 * fVar28 + -fVar25 * fVar25;
        fVar77 = fVar50 * fVar50 - fVar34 * fVar34;
        fVar65 = fVar28 * fVar28 + fVar77 + -fVar25 * fVar25;
        fVar78 = fVar34 * fVar25 - fVar28 * fVar50;
        fVar24 = fVar28 * fVar50 + fVar34 * fVar25;
        fVar73 = fVar28 * fVar25 + fVar34 * fVar50;
        fVar50 = fVar28 * fVar25 - fVar34 * fVar50;
        fVar68 = fVar68 + fVar68;
        fVar78 = fVar78 + fVar78;
        fVar82 = in_XMM10._0_4_;
        fVar34 = fVar25 * fVar25 + fVar77 + -fVar28 * fVar28;
        fVar53 = fVar52 * 1.0 + fVar68 * 0.0 + fVar78 * 0.0;
        fVar60 = fVar52 * 0.0 + fVar68 * 1.0 + fVar78 * 0.0;
        fVar61 = fVar52 * 0.0 + fVar68 * 0.0 + fVar78 * 1.0;
        fVar78 = fVar52 * 0.0 + fVar68 * 0.0 + fVar78 * 0.0;
        fVar73 = fVar73 + fVar73;
        fVar51 = fVar51 + fVar51;
        fVar52 = fVar51 * 1.0 + fVar65 * 0.0 + fVar73 * 0.0;
        fVar68 = fVar51 * 0.0 + fVar65 * 1.0 + fVar73 * 0.0;
        fVar77 = fVar51 * 0.0 + fVar65 * 0.0 + fVar73 * 1.0;
        fVar65 = fVar51 * 0.0 + fVar65 * 0.0 + fVar73 * 0.0;
        auVar63._0_8_ = in_XMM10._4_8_;
        auVar63._8_8_ = 0;
        auVar22 = blendps(auVar63,in_XMM4,4);
        fVar24 = fVar24 + fVar24;
        fVar50 = fVar50 + fVar50;
        fVar25 = fVar24 * 1.0 + fVar50 * 0.0 + fVar34 * 0.0;
        fVar28 = fVar24 * 0.0 + fVar50 * 1.0 + fVar34 * 0.0;
        fVar51 = fVar24 * 0.0 + fVar50 * 0.0 + fVar34 * 1.0;
        fVar24 = fVar24 * 0.0 + fVar50 * 0.0 + fVar34 * 0.0;
        fVar34 = fVar24 * 0.0;
        in_XMM14._0_4_ = fVar82 * fVar53 + fVar52 * 0.0 + fVar25 * 0.0;
        in_XMM14._4_4_ = fVar82 * fVar60 + fVar68 * 0.0 + fVar28 * 0.0;
        in_XMM14._8_4_ = fVar82 * fVar61 + fVar77 * 0.0 + fVar51 * 0.0;
        in_XMM14._12_4_ = fVar82 * fVar78 + fVar65 * 0.0 + fVar34;
        fVar50 = in_XMM4._0_4_;
        in_XMM1._0_4_ = fVar50 * fVar53 + fVar33 * fVar52 + fVar25 * 0.0;
        in_XMM1._4_4_ = fVar50 * fVar60 + fVar33 * fVar68 + fVar28 * 0.0;
        in_XMM1._8_4_ = fVar50 * fVar61 + fVar33 * fVar77 + fVar51 * 0.0;
        in_XMM1._12_4_ = fVar50 * fVar78 + fVar33 * fVar65 + fVar34;
        fVar33 = in_XMM3._4_4_;
        fVar50 = in_XMM3._0_4_;
        in_XMM0._0_4_ = fVar50 * fVar53 + fVar33 * fVar52 + fVar76 * fVar25;
        in_XMM0._4_4_ = fVar50 * fVar60 + fVar33 * fVar68 + fVar76 * fVar28;
        in_XMM0._8_4_ = fVar50 * fVar61 + fVar33 * fVar77 + fVar76 * fVar51;
        in_XMM0._12_4_ = fVar50 * fVar78 + fVar33 * fVar65 + fVar76 * fVar24;
        fVar24 = in_XMM2._4_4_;
        fVar50 = in_XMM2._0_4_;
        auVar45._0_4_ = fVar50 * fVar53 + fVar24 * fVar52 + fVar62 * fVar25 + auVar22._0_4_ + 0.0;
        auVar45._4_4_ = fVar50 * fVar60 + fVar24 * fVar68 + fVar62 * fVar28 + auVar22._4_4_ + 0.0;
        auVar45._8_4_ = fVar50 * fVar61 + fVar24 * fVar77 + fVar62 * fVar51 + auVar22._8_4_ + 0.0;
      }
      else if (iVar4 == 0x9134) {
        lVar8 = *plVar7;
        lVar13 = uVar12 * plVar7[2];
        auVar22 = insertps(ZEXT416(*(uint *)(lVar8 + lVar13)),*(undefined4 *)(lVar8 + 0x10 + lVar13)
                           ,0x1c);
        in_XMM14 = insertps(auVar22,*(undefined4 *)(lVar8 + 0x20 + lVar13),0x28);
        auVar22 = insertps(ZEXT416(*(uint *)(lVar8 + 4 + lVar13)),
                           *(undefined4 *)(lVar8 + 0x14 + lVar13),0x1c);
        in_XMM1 = insertps(auVar22,*(undefined4 *)(lVar8 + 0x24 + lVar13),0x28);
        auVar22 = insertps(ZEXT416(*(uint *)(lVar8 + 8 + lVar13)),
                           *(undefined4 *)(lVar8 + 0x18 + lVar13),0x1c);
        in_XMM0 = insertps(auVar22,*(undefined4 *)(lVar8 + 0x28 + lVar13),0x28);
        auVar22 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar13)),
                           *(undefined4 *)(lVar8 + 0x1c + lVar13),0x1c);
        auVar22 = insertps(auVar22,*(undefined4 *)(lVar8 + 0x2c + lVar13),0x28);
        auVar45 = auVar22._0_12_;
      }
      else if (iVar4 == 0x9234) {
        lVar8 = *plVar7;
        lVar13 = uVar12 * plVar7[2];
        uVar3 = *(undefined8 *)(lVar8 + 4 + lVar13);
        in_XMM14._4_4_ = (float)(int)uVar3;
        in_XMM14._0_4_ = (float)*(undefined4 *)(lVar8 + lVar13);
        in_XMM14._8_4_ = (float)(int)((ulong)uVar3 >> 0x20);
        in_XMM14._12_4_ = 0.0;
        uVar3 = *(undefined8 *)(lVar8 + 0x10 + lVar13);
        in_XMM1._4_4_ = (float)(int)uVar3;
        in_XMM1._0_4_ = (float)*(undefined4 *)(lVar8 + 0xc + lVar13);
        in_XMM1._8_4_ = (float)(int)((ulong)uVar3 >> 0x20);
        in_XMM1._12_4_ = 0.0;
        uVar3 = *(undefined8 *)(lVar8 + 0x1c + lVar13);
        in_XMM0._4_4_ = (float)(int)uVar3;
        in_XMM0._0_4_ = (float)*(undefined4 *)(lVar8 + 0x18 + lVar13);
        in_XMM0._8_4_ = (float)(int)((ulong)uVar3 >> 0x20);
        in_XMM0._12_4_ = 0.0;
        uVar3 = *(undefined8 *)(lVar8 + 0x28 + lVar13);
        auVar45._4_4_ = (float)(int)uVar3;
        auVar45._0_4_ = (float)*(undefined4 *)(lVar8 + 0x24 + lVar13);
        auVar45._8_4_ = (float)(int)((ulong)uVar3 >> 0x20);
      }
      else if (iVar4 == 0xb001) {
        lVar8 = *plVar7;
        lVar13 = uVar12 * plVar7[2];
        auVar19._8_8_ = 0;
        auVar19._0_8_ = *(ulong *)(lVar8 + 0x10 + lVar13);
        auVar22 = insertps(auVar19,*(undefined4 *)(lVar8 + 8 + lVar13),0x20);
        uVar3 = *(undefined8 *)(lVar8 + 0x34 + lVar13);
        auVar84._4_4_ = (int)uVar3;
        auVar84._0_4_ = *(undefined4 *)(lVar8 + lVar13);
        auVar84._8_4_ = (int)((ulong)uVar3 >> 0x20);
        auVar84._12_4_ = 0;
        uVar3 = *(undefined8 *)(lVar8 + 0x1c + lVar13);
        auVar46._4_4_ = (int)uVar3;
        auVar46._0_4_ = *(undefined4 *)(lVar8 + 0x18 + lVar13);
        auVar46._8_4_ = (int)((ulong)uVar3 >> 0x20);
        auVar46._12_4_ = 0;
        fVar50 = *(float *)(lVar8 + 0x24 + lVar13);
        fVar24 = *(float *)(lVar8 + 0x28 + lVar13);
        fVar25 = *(float *)(lVar8 + 0x2c + lVar13);
        fVar28 = *(float *)(lVar8 + 0x30 + lVar13);
        fVar62 = fVar28 * fVar28 + fVar25 * fVar25 + fVar50 * fVar50 + fVar24 * fVar24;
        auVar86 = rsqrtss(ZEXT416((uint)fVar62),ZEXT416((uint)fVar62));
        fVar51 = auVar86._0_4_;
        auVar55._4_12_ = auVar86._4_12_;
        fVar51 = fVar51 * fVar51 * fVar62 * -0.5 * fVar51 + fVar51 * 1.5;
        auVar86 = insertps(auVar46,ZEXT416((uint)(fVar50 * fVar51)),0x30);
        auVar45 = auVar86._0_12_;
        in_XMM14 = insertps(auVar84,ZEXT416((uint)(fVar24 * fVar51)),0x30);
        auVar55._0_4_ = fVar51 * fVar28;
        auVar86 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar13)),
                           *(undefined4 *)(lVar8 + 4 + lVar13),0x10);
        in_XMM0 = insertps(auVar22,auVar55,0x30);
        auVar22 = insertps(auVar86,*(undefined4 *)(lVar8 + 0x3c + lVar13),0x20);
        in_XMM1 = insertps(auVar22,ZEXT416((uint)(fVar25 * fVar51)),0x30);
      }
      else if (iVar4 == 0x9244) {
        lVar8 = *plVar7;
        lVar13 = uVar12 * plVar7[2];
        in_XMM14 = *(undefined1 (*) [16])(lVar8 + lVar13);
        in_XMM1 = *(undefined1 (*) [16])(lVar8 + 0x10 + lVar13);
        in_XMM0 = *(undefined1 (*) [16])(lVar8 + 0x20 + lVar13);
        auVar45 = SUB1612(*(undefined1 (*) [16])(lVar8 + 0x30 + lVar13),0);
      }
    }
    else {
      fVar50 = (pGVar5->time_range).lower;
      auVar29._0_4_ = (pGVar5->time_range).upper - fVar50;
      auVar29._4_8_ = 0;
      fVar24 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar50) / auVar29._0_4_) *
               pGVar5->fnumTimeSegments;
      auVar22 = roundss(ZEXT416((uint)fVar50),ZEXT416((uint)fVar24),9);
      fVar50 = pGVar5->fnumTimeSegments + -1.0;
      if (fVar50 <= auVar22._0_4_) {
        auVar22._0_4_ = fVar50;
      }
      auVar18 = ZEXT812(0);
      if (0.0 <= auVar22._0_4_) {
        auVar18._4_8_ = 0;
        auVar18._0_4_ = auVar22._0_4_;
      }
      auVar86._12_4_ = 0;
      auVar86._0_12_ = auVar18;
      uVar14 = (uint)auVar18._0_4_;
      fVar24 = fVar24 - auVar18._0_4_;
      lVar8 = *(long *)&pGVar5[1].fnumTimeSegments;
      plVar7 = (long *)(lVar8 + (ulong)uVar14 * 0x38);
      iVar4 = *(int *)(lVar8 + 0x20 + (ulong)uVar14 * 0x38);
      if ((pGVar5->field_8).field_0x1 == '\x01') {
        if (iVar4 == 0x9134) {
          lVar13 = *plVar7;
          lVar16 = plVar7[2] * uVar12;
          auVar22 = insertps(ZEXT416(*(uint *)(lVar13 + lVar16)),
                             *(undefined4 *)(lVar13 + 0x10 + lVar16),0x1c);
          _local_188 = insertps(auVar22,*(undefined4 *)(lVar13 + 0x20 + lVar16),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(lVar13 + 4 + lVar16)),
                             *(undefined4 *)(lVar13 + 0x14 + lVar16),0x1c);
          _local_158 = insertps(auVar22,*(undefined4 *)(lVar13 + 0x24 + lVar16),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(lVar13 + 8 + lVar16)),
                             *(undefined4 *)(lVar13 + 0x18 + lVar16),0x1c);
          _local_198 = insertps(auVar22,*(undefined4 *)(lVar13 + 0x28 + lVar16),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(lVar13 + 0xc + lVar16)),
                             *(undefined4 *)(lVar13 + 0x1c + lVar16),0x1c);
          _local_168 = insertps(auVar22,*(undefined4 *)(lVar13 + 0x2c + lVar16),0x28);
        }
        else if (iVar4 == 0x9234) {
          lVar13 = *plVar7;
          lVar16 = plVar7[2] * uVar12;
          uVar3 = *(undefined8 *)(lVar13 + 4 + lVar16);
          local_188._4_4_ = (int)uVar3;
          local_188._0_4_ = *(undefined4 *)(lVar13 + lVar16);
          uStack_180._0_4_ = (float)(int)((ulong)uVar3 >> 0x20);
          uStack_180._4_4_ = 0.0;
          uVar3 = *(undefined8 *)(lVar13 + 0x10 + lVar16);
          local_158._4_4_ = (int)uVar3;
          local_158._0_4_ = *(undefined4 *)(lVar13 + 0xc + lVar16);
          fStack_150 = (float)(int)((ulong)uVar3 >> 0x20);
          fStack_14c = 0.0;
          uVar3 = *(undefined8 *)(lVar13 + 0x1c + lVar16);
          local_198._4_4_ = (int)uVar3;
          local_198._0_4_ = *(undefined4 *)(lVar13 + 0x18 + lVar16);
          uStack_190._0_4_ = (float)(int)((ulong)uVar3 >> 0x20);
          uStack_190._4_4_ = 0.0;
          uVar3 = *(undefined8 *)(lVar13 + 0x28 + lVar16);
          local_168._4_4_ = (int)uVar3;
          local_168._0_4_ = *(undefined4 *)(lVar13 + 0x24 + lVar16);
          fStack_160 = (float)(int)((ulong)uVar3 >> 0x20);
          fStack_15c = 0.0;
        }
        else if (iVar4 == 0xb001) {
          lVar13 = *plVar7;
          lVar16 = plVar7[2] * uVar12;
          auVar67._8_8_ = 0;
          auVar67._0_8_ = *(ulong *)(lVar13 + 0x10 + lVar16);
          auVar86 = insertps(auVar67,*(undefined4 *)(lVar13 + 8 + lVar16),0x20);
          uVar3 = *(undefined8 *)(lVar13 + 0x34 + lVar16);
          auVar74._4_4_ = (int)uVar3;
          auVar74._0_4_ = *(undefined4 *)(lVar13 + lVar16);
          auVar74._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar74._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar13 + 0x1c + lVar16);
          auVar70._4_4_ = (int)uVar3;
          auVar70._0_4_ = *(undefined4 *)(lVar13 + 0x18 + lVar16);
          auVar70._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar70._12_4_ = 0;
          fVar50 = *(float *)(lVar13 + 0x24 + lVar16);
          fVar25 = *(float *)(lVar13 + 0x28 + lVar16);
          fVar28 = *(float *)(lVar13 + 0x2c + lVar16);
          fVar51 = *(float *)(lVar13 + 0x30 + lVar16);
          fVar76 = fVar51 * fVar51 + fVar28 * fVar28 + fVar50 * fVar50 + fVar25 * fVar25;
          auVar22 = rsqrtss(ZEXT416((uint)fVar76),ZEXT416((uint)fVar76));
          fVar62 = auVar22._0_4_;
          auVar38._4_12_ = auVar22._4_12_;
          fVar62 = fVar62 * fVar62 * fVar76 * -0.5 * fVar62 + fVar62 * 1.5;
          in_XMM10 = insertps(auVar70,ZEXT416((uint)(fVar50 * fVar62)),0x30);
          in_XMM7 = insertps(auVar74,ZEXT416((uint)(fVar25 * fVar62)),0x30);
          auVar38._0_4_ = fVar62 * fVar51;
          auVar22 = insertps(ZEXT416(*(uint *)(lVar13 + 0xc + lVar16)),
                             *(undefined4 *)(lVar13 + 4 + lVar16),0x10);
          in_XMM9 = insertps(auVar86,auVar38,0x30);
          auVar22 = insertps(auVar22,*(undefined4 *)(lVar13 + 0x3c + lVar16),0x20);
          in_XMM8 = insertps(auVar22,ZEXT416((uint)(fVar28 * fVar62)),0x30);
          _local_198 = in_XMM9;
          _local_188 = in_XMM7;
          _local_168 = in_XMM10;
          _local_158 = in_XMM8;
        }
        else if (iVar4 == 0x9244) {
          lVar13 = *plVar7;
          lVar16 = plVar7[2] * uVar12;
          _local_188 = *(undefined1 (*) [16])(lVar13 + lVar16);
          _local_158 = *(undefined1 (*) [16])(lVar13 + 0x10 + lVar16);
          _local_198 = *(undefined1 (*) [16])(lVar13 + 0x20 + lVar16);
          _local_168 = *(undefined1 (*) [16])(lVar13 + 0x30 + lVar16);
        }
        lVar13 = (ulong)(uVar14 + 1) * 0x38;
        plVar7 = (long *)(lVar8 + lVar13);
        iVar4 = *(int *)(lVar8 + 0x20 + lVar13);
        if (iVar4 == 0x9134) {
          lVar8 = *plVar7;
          lVar13 = uVar12 * plVar7[2];
          auVar22 = insertps(ZEXT416(*(uint *)(lVar8 + lVar13)),
                             *(undefined4 *)(lVar8 + 0x10 + lVar13),0x1c);
          in_XMM7 = insertps(auVar22,*(undefined4 *)(lVar8 + 0x20 + lVar13),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(lVar8 + 4 + lVar13)),
                             *(undefined4 *)(lVar8 + 0x14 + lVar13),0x1c);
          in_XMM9 = insertps(auVar22,*(undefined4 *)(lVar8 + 0x24 + lVar13),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(lVar8 + 8 + lVar13)),
                             *(undefined4 *)(lVar8 + 0x18 + lVar13),0x1c);
          in_XMM8 = insertps(auVar22,*(undefined4 *)(lVar8 + 0x28 + lVar13),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar13)),
                             *(undefined4 *)(lVar8 + 0x1c + lVar13),0x1c);
          in_XMM10 = insertps(auVar22,*(undefined4 *)(lVar8 + 0x2c + lVar13),0x28);
        }
        else if (iVar4 == 0x9234) {
          lVar8 = *plVar7;
          lVar13 = uVar12 * plVar7[2];
          uVar3 = *(undefined8 *)(lVar8 + 4 + lVar13);
          in_XMM7._4_4_ = (int)uVar3;
          in_XMM7._0_4_ = *(undefined4 *)(lVar8 + lVar13);
          in_XMM7._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM7._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x10 + lVar13);
          in_XMM9._4_4_ = (int)uVar3;
          in_XMM9._0_4_ = *(undefined4 *)(lVar8 + 0xc + lVar13);
          in_XMM9._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM9._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x1c + lVar13);
          in_XMM8._4_4_ = (int)uVar3;
          in_XMM8._0_4_ = *(undefined4 *)(lVar8 + 0x18 + lVar13);
          in_XMM8._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM8._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x28 + lVar13);
          in_XMM10._4_4_ = (int)uVar3;
          in_XMM10._0_4_ = *(undefined4 *)(lVar8 + 0x24 + lVar13);
          in_XMM10._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM10._12_4_ = 0;
        }
        else if (iVar4 == 0xb001) {
          lVar8 = *plVar7;
          lVar13 = uVar12 * plVar7[2];
          auVar64._8_8_ = 0;
          auVar64._0_8_ = *(ulong *)(lVar8 + 0x10 + lVar13);
          auVar86 = insertps(auVar64,*(undefined4 *)(lVar8 + 8 + lVar13),0x20);
          uVar3 = *(undefined8 *)(lVar8 + 0x34 + lVar13);
          auVar59._4_4_ = (int)uVar3;
          auVar59._0_4_ = *(undefined4 *)(lVar8 + lVar13);
          auVar59._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar59._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x1c + lVar13);
          auVar71._4_4_ = (int)uVar3;
          auVar71._0_4_ = *(undefined4 *)(lVar8 + 0x18 + lVar13);
          auVar71._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar71._12_4_ = 0;
          fVar50 = *(float *)(lVar8 + 0x24 + lVar13);
          fVar25 = *(float *)(lVar8 + 0x28 + lVar13);
          fVar28 = *(float *)(lVar8 + 0x2c + lVar13);
          fVar51 = *(float *)(lVar8 + 0x30 + lVar13);
          fVar76 = fVar51 * fVar51 + fVar28 * fVar28 + fVar50 * fVar50 + fVar25 * fVar25;
          auVar22 = rsqrtss(ZEXT416((uint)fVar76),ZEXT416((uint)fVar76));
          fVar62 = auVar22._0_4_;
          auVar43._4_12_ = auVar22._4_12_;
          fVar62 = fVar62 * fVar62 * fVar76 * -0.5 * fVar62 + fVar62 * 1.5;
          in_XMM10 = insertps(auVar71,ZEXT416((uint)(fVar50 * fVar62)),0x30);
          in_XMM7 = insertps(auVar59,ZEXT416((uint)(fVar25 * fVar62)),0x30);
          auVar43._0_4_ = fVar62 * fVar51;
          auVar22 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar13)),
                             *(undefined4 *)(lVar8 + 4 + lVar13),0x10);
          in_XMM8 = insertps(auVar86,auVar43,0x30);
          auVar22 = insertps(auVar22,*(undefined4 *)(lVar8 + 0x3c + lVar13),0x20);
          in_XMM9 = insertps(auVar22,ZEXT416((uint)(fVar28 * fVar62)),0x30);
        }
        else if (iVar4 == 0x9244) {
          lVar8 = *plVar7;
          lVar13 = uVar12 * plVar7[2];
          in_XMM7 = *(undefined1 (*) [16])(lVar8 + lVar13);
          in_XMM9 = *(undefined1 (*) [16])(lVar8 + 0x10 + lVar13);
          in_XMM8 = *(undefined1 (*) [16])(lVar8 + 0x20 + lVar13);
          in_XMM10 = *(undefined1 (*) [16])(lVar8 + 0x30 + lVar13);
        }
        fVar50 = in_XMM10._12_4_;
        fVar25 = in_XMM7._12_4_;
        fVar62 = in_XMM9._12_4_;
        local_c8 = in_XMM8._12_4_;
        fVar51 = uStack_190._4_4_ * local_c8 +
                 fStack_14c * fVar62 + fStack_15c * fVar50 + uStack_180._4_4_ * fVar25;
        fVar28 = -fVar51;
        if (fVar51 < fVar28) {
          fVar50 = -fVar50;
          fVar25 = -fVar25;
          local_c8 = -local_c8;
        }
        fVar76 = fVar28;
        if (fVar28 <= fVar51) {
          fVar76 = fVar51;
        }
        fVar34 = ABS(fVar51);
        local_148 = -fVar62;
        fVar33 = 1.0 - fVar34;
        if (fVar33 < 0.0) {
          fVar33 = sqrtf(fVar33);
        }
        else {
          fVar33 = SQRT(fVar33);
        }
        fVar52 = 1.5707964 -
                 fVar33 * (((((fVar34 * -0.0043095737 + 0.0192803) * fVar34 + -0.04489909) * fVar34
                            + 0.08785567) * fVar34 + -0.21450998) * fVar34 + 1.5707952);
        fVar33 = 0.0;
        if (0.0 <= fVar52) {
          fVar33 = fVar52;
        }
        fVar34 = (float)(-(uint)(1.0 < fVar34) & 0x7fc00000 |
                        ~-(uint)(1.0 < fVar34) &
                        (uint)(1.5707964 -
                              (float)((uint)-fVar33 & -(uint)(fVar76 < 0.0) |
                                     ~-(uint)(fVar76 < 0.0) & (uint)fVar33))) * fVar24;
        auVar22 = ZEXT416((uint)(fVar34 * 0.63661975));
        auVar22 = roundss(auVar22,auVar22,9);
        uVar14 = (uint)auVar22._0_4_;
        fVar34 = fVar34 - auVar22._0_4_ * 1.5707964;
        fVar33 = fVar34 * fVar34;
        uVar15 = uVar14 & 3;
        fVar52 = ((((fVar33 * -2.5963018e-07 + 2.4756235e-05) * fVar33 + -0.001388833) * fVar33 +
                  0.04166664) * fVar33 + -0.5) * fVar33 + 1.0;
        fVar34 = (((((fVar33 * -2.5029328e-08 + 2.7600126e-06) * fVar33 + -0.00019842605) * fVar33 +
                   0.008333348) * fVar33 + -0.16666667) * fVar33 + 1.0) * fVar34;
        fVar33 = fVar52;
        if ((uVar14 & 1) != 0) {
          fVar33 = fVar34;
          fVar34 = fVar52;
        }
        fVar28 = (float)(~-(uint)(fVar51 < fVar28) & (uint)fVar62 |
                        (uint)local_148 & -(uint)(fVar51 < fVar28));
        if (1 < uVar15) {
          fVar34 = -fVar34;
        }
        if (uVar15 - 1 < 2) {
          fVar33 = -fVar33;
        }
        fVar51 = fVar76 * fStack_15c - fVar50;
        fVar65 = fVar76 * uStack_180._4_4_ - fVar25;
        fVar77 = fVar76 * fStack_14c - fVar28;
        fVar68 = fVar76 * uStack_190._4_4_ - local_c8;
        auVar47._0_8_ = CONCAT44(uStack_190._4_4_,fVar68) ^ 0x8000000000000000;
        auVar47._8_4_ = -uStack_190._4_4_;
        auVar47._12_4_ = -uStack_190._4_4_;
        auVar48._4_12_ = auVar47._4_12_;
        auVar48._0_4_ = fVar68 * fVar68 + fVar77 * fVar77 + fVar51 * fVar51 + fVar65 * fVar65;
        auVar72._0_8_ = CONCAT44(uStack_190._4_4_,auVar48._0_4_) ^ 0x8000000000000000;
        auVar72._8_4_ = -uStack_190._4_4_;
        auVar72._12_4_ = -uStack_190._4_4_;
        auVar22 = rsqrtss(auVar72,auVar48);
        fVar52 = auVar22._0_4_;
        fVar53 = fVar52 * fVar52 * auVar48._0_4_ * -0.5 * fVar52 + fVar52 * 1.5;
        fVar60 = 1.0 - fVar24;
        fVar78 = fStack_15c * fVar60 + fVar50 * fVar24;
        fVar52 = fVar60 * uStack_180._4_4_ + fVar25 * fVar24;
        fVar50 = fVar60 * fStack_14c + fVar28 * fVar24;
        fVar25 = fVar60 * uStack_190._4_4_ + local_c8 * fVar24;
        fVar61 = fVar25 * fVar25 + fVar50 * fVar50 + fVar78 * fVar78 + fVar52 * fVar52;
        auVar22 = rsqrtss(ZEXT416((uint)fVar61),ZEXT416((uint)fVar61));
        fVar28 = auVar22._0_4_;
        fVar61 = fVar28 * fVar28 * fVar61 * -0.5 * fVar28 + fVar28 * 1.5;
        fVar28 = (float)(-(uint)(0.9995 < fVar76) & (uint)(fVar78 * fVar61) |
                        ~-(uint)(0.9995 < fVar76) &
                        (uint)(fVar33 * fStack_15c - fVar51 * fVar53 * fVar34));
        if (0.9995 < fVar76) {
          fVar52 = fVar52 * fVar61;
          fVar50 = fVar50 * fVar61;
          fVar25 = fVar25 * fVar61;
        }
        else {
          fVar52 = uStack_180._4_4_ * fVar33 - fVar65 * fVar53 * fVar34;
          fVar50 = fStack_14c * fVar33 - fVar77 * fVar53 * fVar34;
          fVar25 = uStack_190._4_4_ * fVar33 - fVar68 * fVar53 * fVar34;
        }
        local_48 = in_XMM7._0_4_;
        fStack_44 = in_XMM7._4_4_;
        fStack_40 = in_XMM7._8_4_;
        fVar83 = (float)local_188._0_4_ * fVar60 + local_48 * fVar24;
        local_68 = in_XMM9._0_4_;
        fStack_64 = in_XMM9._4_4_;
        fStack_60 = in_XMM9._8_4_;
        fVar88 = (float)local_158._0_4_ * fVar60 + local_68 * fVar24;
        fVar89 = (float)local_158._4_4_ * fVar60 + fStack_64 * fVar24;
        local_58 = in_XMM8._0_4_;
        fStack_54 = in_XMM8._4_4_;
        fStack_50 = in_XMM8._8_4_;
        fVar77 = (float)local_198._0_4_ * fVar60 + local_58 * fVar24;
        fVar61 = (float)local_198._4_4_ * fVar60 + fStack_54 * fVar24;
        fVar73 = (float)uStack_190 * fVar60 + fStack_50 * fVar24;
        local_78 = in_XMM10._0_4_;
        fStack_74 = in_XMM10._4_4_;
        fStack_70 = in_XMM10._8_4_;
        fVar79 = fVar60 * (float)local_168._0_4_ + fVar24 * local_78;
        fVar80 = fVar60 * (float)local_168._4_4_ + fVar24 * fStack_74;
        fVar81 = fVar60 * fStack_160 + fVar24 * fStack_70;
        fVar33 = fVar28 * fVar28 + fVar52 * fVar52 + -fVar50 * fVar50 + -fVar25 * fVar25;
        fVar53 = fVar52 * fVar50 + fVar28 * fVar25;
        fVar65 = fVar52 * fVar50 - fVar28 * fVar25;
        fVar76 = fVar28 * fVar28 - fVar52 * fVar52;
        fVar66 = fVar50 * fVar50 + fVar76 + -fVar25 * fVar25;
        fVar78 = fVar52 * fVar25 - fVar28 * fVar50;
        fVar51 = fVar28 * fVar50 + fVar52 * fVar25;
        fVar44 = fVar50 * fVar25 + fVar28 * fVar52;
        fVar28 = fVar50 * fVar25 - fVar28 * fVar52;
        fVar53 = fVar53 + fVar53;
        fVar78 = fVar78 + fVar78;
        fVar76 = fVar25 * fVar25 + fVar76 + -fVar50 * fVar50;
        fVar34 = fVar33 * 1.0 + fVar53 * 0.0 + fVar78 * 0.0;
        fVar52 = fVar33 * 0.0 + fVar53 * 1.0 + fVar78 * 0.0;
        fVar68 = fVar33 * 0.0 + fVar53 * 0.0 + fVar78 * 1.0;
        fVar33 = fVar33 * 0.0 + fVar53 * 0.0 + fVar78 * 0.0;
        fVar44 = fVar44 + fVar44;
        fVar65 = fVar65 + fVar65;
        fVar53 = fVar65 * 1.0 + fVar66 * 0.0 + fVar44 * 0.0;
        fVar78 = fVar65 * 0.0 + fVar66 * 1.0 + fVar44 * 0.0;
        fVar82 = fVar65 * 0.0 + fVar66 * 0.0 + fVar44 * 1.0;
        fVar65 = fVar65 * 0.0 + fVar66 * 0.0 + fVar44 * 0.0;
        auVar49._4_4_ = (float)uStack_180 * fVar60 + fStack_40 * fVar24;
        auVar49._0_4_ = (float)local_188._4_4_ * fVar60 + fStack_44 * fVar24;
        auVar49._8_8_ = 0;
        auVar9._4_4_ = fVar89;
        auVar9._0_4_ = fVar88;
        auVar9._8_4_ = fStack_150 * fVar60 + fStack_60 * fVar24;
        auVar9._12_4_ = fStack_14c * fVar60 + fVar62 * fVar24;
        auVar22 = blendps(auVar49,auVar9,4);
        fVar51 = fVar51 + fVar51;
        fVar28 = fVar28 + fVar28;
        fVar50 = fVar51 * 1.0 + fVar28 * 0.0 + fVar76 * 0.0;
        fVar24 = fVar51 * 0.0 + fVar28 * 1.0 + fVar76 * 0.0;
        fVar25 = fVar51 * 0.0 + fVar28 * 0.0 + fVar76 * 1.0;
        fVar28 = fVar51 * 0.0 + fVar28 * 0.0 + fVar76 * 0.0;
        fVar51 = fVar28 * 0.0;
        in_XMM14._0_4_ = fVar83 * fVar34 + fVar53 * 0.0 + fVar50 * 0.0;
        in_XMM14._4_4_ = fVar83 * fVar52 + fVar78 * 0.0 + fVar24 * 0.0;
        in_XMM14._8_4_ = fVar83 * fVar68 + fVar82 * 0.0 + fVar25 * 0.0;
        in_XMM14._12_4_ = fVar83 * fVar33 + fVar65 * 0.0 + fVar51;
        in_XMM1._0_4_ = fVar88 * fVar34 + fVar89 * fVar53 + fVar50 * 0.0;
        in_XMM1._4_4_ = fVar88 * fVar52 + fVar89 * fVar78 + fVar24 * 0.0;
        in_XMM1._8_4_ = fVar88 * fVar68 + fVar89 * fVar82 + fVar25 * 0.0;
        in_XMM1._12_4_ = fVar88 * fVar33 + fVar89 * fVar65 + fVar51;
        in_XMM0._0_4_ = fVar77 * fVar34 + fVar61 * fVar53 + fVar73 * fVar50;
        in_XMM0._4_4_ = fVar77 * fVar52 + fVar61 * fVar78 + fVar73 * fVar24;
        in_XMM0._8_4_ = fVar77 * fVar68 + fVar61 * fVar82 + fVar73 * fVar25;
        in_XMM0._12_4_ = fVar77 * fVar33 + fVar61 * fVar65 + fVar73 * fVar28;
        auVar45._0_4_ = fVar79 * fVar34 + fVar80 * fVar53 + fVar81 * fVar50 + auVar22._0_4_ + 0.0;
        auVar45._4_4_ = fVar79 * fVar52 + fVar80 * fVar78 + fVar81 * fVar24 + auVar22._4_4_ + 0.0;
        auVar45._8_4_ = fVar79 * fVar68 + fVar80 * fVar82 + fVar81 * fVar25 + auVar22._8_4_ + 0.0;
      }
      else {
        if (iVar4 == 0x9134) {
          lVar13 = *plVar7;
          lVar16 = plVar7[2] * uVar12;
          auVar22 = insertps(ZEXT416(*(uint *)(lVar13 + lVar16)),
                             *(undefined4 *)(lVar13 + 0x10 + lVar16),0x1c);
          in_XMM14 = insertps(auVar22,*(undefined4 *)(lVar13 + 0x20 + lVar16),0x28);
          auVar22 = insertps(ZEXT416(*(uint *)(lVar13 + 4 + lVar16)),
                             *(undefined4 *)(lVar13 + 0x14 + lVar16),0x1c);
          auVar22 = insertps(auVar22,*(undefined4 *)(lVar13 + 0x24 + lVar16),0x28);
          auVar86 = insertps(ZEXT416(*(uint *)(lVar13 + 8 + lVar16)),
                             *(undefined4 *)(lVar13 + 0x18 + lVar16),0x1c);
          auVar86 = insertps(auVar86,*(undefined4 *)(lVar13 + 0x28 + lVar16),0x28);
          auVar38 = insertps(ZEXT416(*(uint *)(lVar13 + 0xc + lVar16)),
                             *(undefined4 *)(lVar13 + 0x1c + lVar16),0x1c);
          auVar38 = insertps(auVar38,*(undefined4 *)(lVar13 + 0x2c + lVar16),0x28);
          auVar29 = auVar38._0_12_;
        }
        else if (iVar4 == 0x9234) {
          lVar13 = *plVar7;
          lVar16 = plVar7[2] * uVar12;
          uVar3 = *(undefined8 *)(lVar13 + 4 + lVar16);
          in_XMM14._4_4_ = (float)(int)uVar3;
          in_XMM14._0_4_ = (float)*(undefined4 *)(lVar13 + lVar16);
          in_XMM14._8_4_ = (float)(int)((ulong)uVar3 >> 0x20);
          in_XMM14._12_4_ = 0.0;
          uVar3 = *(undefined8 *)(lVar13 + 0x10 + lVar16);
          auVar22._4_4_ = (int)uVar3;
          auVar22._0_4_ = *(undefined4 *)(lVar13 + 0xc + lVar16);
          auVar22._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar22._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar13 + 0x1c + lVar16);
          auVar86._4_4_ = (int)uVar3;
          auVar86._0_4_ = *(undefined4 *)(lVar13 + 0x18 + lVar16);
          auVar86._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar86._12_4_ = 0;
          uVar2 = *(ulong *)(lVar13 + 0x28 + lVar16);
          in_XMM3._8_8_ = 0;
          in_XMM3._0_8_ = uVar2;
          auVar29._4_4_ = (int)uVar2;
          auVar29._0_4_ = (float)*(undefined4 *)(lVar13 + 0x24 + lVar16);
          auVar29._8_4_ = (int)(uVar2 >> 0x20);
        }
        else if (iVar4 == 0xb001) {
          lVar13 = *plVar7;
          lVar16 = plVar7[2] * uVar12;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = *(ulong *)(lVar13 + 0x10 + lVar16);
          auVar22 = insertps(auVar20,*(undefined4 *)(lVar13 + 8 + lVar16),0x20);
          uVar3 = *(undefined8 *)(lVar13 + 0x34 + lVar16);
          auVar85._4_4_ = (int)uVar3;
          auVar85._0_4_ = *(undefined4 *)(lVar13 + lVar16);
          auVar85._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar85._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar13 + 0x1c + lVar16);
          auVar30._4_4_ = (int)uVar3;
          auVar30._0_4_ = *(undefined4 *)(lVar13 + 0x18 + lVar16);
          auVar30._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar30._12_4_ = 0;
          fVar50 = *(float *)(lVar13 + 0x24 + lVar16);
          fVar25 = *(float *)(lVar13 + 0x28 + lVar16);
          fVar28 = *(float *)(lVar13 + 0x2c + lVar16);
          fVar51 = *(float *)(lVar13 + 0x30 + lVar16);
          in_XMM4 = ZEXT416((uint)fVar51);
          fVar76 = fVar51 * fVar51 + fVar28 * fVar28 + fVar50 * fVar50 + fVar25 * fVar25;
          auVar86 = rsqrtss(ZEXT416((uint)fVar76),ZEXT416((uint)fVar76));
          fVar62 = auVar86._0_4_;
          auVar56._4_12_ = auVar86._4_12_;
          fVar62 = fVar62 * fVar62 * fVar76 * -0.5 * fVar62 + fVar62 * 1.5;
          in_XMM6 = ZEXT416((uint)(fVar50 * fVar62));
          auVar86 = insertps(auVar30,in_XMM6,0x30);
          auVar29 = auVar86._0_12_;
          in_XMM14 = insertps(auVar85,ZEXT416((uint)(fVar25 * fVar62)),0x30);
          in_XMM3 = ZEXT416((uint)(fVar28 * fVar62));
          auVar56._0_4_ = fVar62 * fVar51;
          auVar54 = auVar56._0_12_;
          auVar38 = insertps(ZEXT416(*(uint *)(lVar13 + 0xc + lVar16)),
                             *(undefined4 *)(lVar13 + 4 + lVar16),0x10);
          auVar86 = insertps(auVar22,auVar56,0x30);
          auVar22 = insertps(auVar38,*(undefined4 *)(lVar13 + 0x3c + lVar16),0x20);
          auVar22 = insertps(auVar22,in_XMM3,0x30);
        }
        else if (iVar4 == 0x9244) {
          lVar13 = *plVar7;
          lVar16 = plVar7[2] * uVar12;
          in_XMM14 = *(undefined1 (*) [16])(lVar13 + lVar16);
          auVar22 = *(undefined1 (*) [16])(lVar13 + 0x10 + lVar16);
          auVar86 = *(undefined1 (*) [16])(lVar13 + 0x20 + lVar16);
          auVar29 = SUB1612(*(undefined1 (*) [16])(lVar13 + 0x30 + lVar16),0);
        }
        lVar13 = (ulong)(uVar14 + 1) * 0x38;
        plVar7 = (long *)(lVar8 + lVar13);
        iVar4 = *(int *)(lVar8 + 0x20 + lVar13);
        if (iVar4 == 0x9134) {
          lVar8 = *plVar7;
          lVar13 = uVar12 * plVar7[2];
          auVar38 = insertps(ZEXT416(*(uint *)(lVar8 + lVar13)),
                             *(undefined4 *)(lVar8 + 0x10 + lVar13),0x1c);
          in_XMM4 = insertps(auVar38,*(undefined4 *)(lVar8 + 0x20 + lVar13),0x28);
          auVar38 = insertps(ZEXT416(*(uint *)(lVar8 + 4 + lVar13)),
                             *(undefined4 *)(lVar8 + 0x14 + lVar13),0x1c);
          in_XMM6 = insertps(auVar38,*(undefined4 *)(lVar8 + 0x24 + lVar13),0x28);
          auVar38 = insertps(ZEXT416(*(uint *)(lVar8 + 8 + lVar13)),
                             *(undefined4 *)(lVar8 + 0x18 + lVar13),0x1c);
          in_XMM3 = insertps(auVar38,*(undefined4 *)(lVar8 + 0x28 + lVar13),0x28);
          auVar38 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar13)),
                             *(undefined4 *)(lVar8 + 0x1c + lVar13),0x1c);
          auVar38 = insertps(auVar38,*(undefined4 *)(lVar8 + 0x2c + lVar13),0x28);
          auVar54 = auVar38._0_12_;
        }
        else if (iVar4 == 0x9234) {
          lVar8 = *plVar7;
          lVar13 = uVar12 * plVar7[2];
          uVar3 = *(undefined8 *)(lVar8 + 4 + lVar13);
          in_XMM4._4_4_ = (int)uVar3;
          in_XMM4._0_4_ = *(undefined4 *)(lVar8 + lVar13);
          in_XMM4._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM4._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x10 + lVar13);
          in_XMM6._4_4_ = (int)uVar3;
          in_XMM6._0_4_ = *(undefined4 *)(lVar8 + 0xc + lVar13);
          in_XMM6._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM6._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x1c + lVar13);
          in_XMM3._4_4_ = (int)uVar3;
          in_XMM3._0_4_ = *(undefined4 *)(lVar8 + 0x18 + lVar13);
          in_XMM3._8_4_ = (int)((ulong)uVar3 >> 0x20);
          in_XMM3._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x28 + lVar13);
          auVar54._4_4_ = (int)uVar3;
          auVar54._0_4_ = *(undefined4 *)(lVar8 + 0x24 + lVar13);
          auVar54._8_4_ = (int)((ulong)uVar3 >> 0x20);
        }
        else if (iVar4 == 0xb001) {
          lVar8 = *plVar7;
          lVar13 = uVar12 * plVar7[2];
          auVar35._8_8_ = 0;
          auVar35._0_8_ = *(ulong *)(lVar8 + 0x10 + lVar13);
          auVar38 = insertps(auVar35,*(undefined4 *)(lVar8 + 8 + lVar13),0x20);
          uVar3 = *(undefined8 *)(lVar8 + 0x34 + lVar13);
          auVar40._4_4_ = (int)uVar3;
          auVar40._0_4_ = *(undefined4 *)(lVar8 + lVar13);
          auVar40._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar40._12_4_ = 0;
          uVar3 = *(undefined8 *)(lVar8 + 0x1c + lVar13);
          auVar57._4_4_ = (int)uVar3;
          auVar57._0_4_ = *(undefined4 *)(lVar8 + 0x18 + lVar13);
          auVar57._8_4_ = (int)((ulong)uVar3 >> 0x20);
          auVar57._12_4_ = 0;
          fVar50 = *(float *)(lVar8 + 0x24 + lVar13);
          fVar25 = *(float *)(lVar8 + 0x28 + lVar13);
          fVar28 = *(float *)(lVar8 + 0x2c + lVar13);
          fVar51 = *(float *)(lVar8 + 0x30 + lVar13);
          fVar76 = fVar51 * fVar51 + fVar28 * fVar28 + fVar50 * fVar50 + fVar25 * fVar25;
          auVar74 = rsqrtss(ZEXT416((uint)fVar76),ZEXT416((uint)fVar76));
          fVar62 = auVar74._0_4_;
          auVar75._4_12_ = auVar74._4_12_;
          fVar62 = fVar62 * fVar62 * fVar76 * -0.5 * fVar62 + fVar62 * 1.5;
          auVar74 = insertps(auVar57,ZEXT416((uint)(fVar50 * fVar62)),0x30);
          auVar54 = auVar74._0_12_;
          in_XMM4 = insertps(auVar40,ZEXT416((uint)(fVar25 * fVar62)),0x30);
          auVar75._0_4_ = fVar62 * fVar51;
          auVar74 = insertps(ZEXT416(*(uint *)(lVar8 + 0xc + lVar13)),
                             *(undefined4 *)(lVar8 + 4 + lVar13),0x10);
          in_XMM3 = insertps(auVar38,auVar75,0x30);
          auVar38 = insertps(auVar74,*(undefined4 *)(lVar8 + 0x3c + lVar13),0x20);
          in_XMM6 = insertps(auVar38,ZEXT416((uint)(fVar28 * fVar62)),0x30);
        }
        else if (iVar4 == 0x9244) {
          lVar8 = *plVar7;
          lVar13 = uVar12 * plVar7[2];
          in_XMM4 = *(undefined1 (*) [16])(lVar8 + lVar13);
          in_XMM6 = *(undefined1 (*) [16])(lVar8 + 0x10 + lVar13);
          in_XMM3 = *(undefined1 (*) [16])(lVar8 + 0x20 + lVar13);
          auVar54 = SUB1612(*(undefined1 (*) [16])(lVar8 + 0x30 + lVar13),0);
        }
        fVar50 = 1.0 - fVar24;
        fVar25 = in_XMM14._4_4_;
        fVar28 = in_XMM14._8_4_;
        fVar51 = in_XMM14._12_4_;
        in_XMM14._0_4_ = in_XMM14._0_4_ * fVar50 + in_XMM4._0_4_ * fVar24;
        in_XMM14._4_4_ = fVar25 * fVar50 + in_XMM4._4_4_ * fVar24;
        in_XMM14._8_4_ = fVar28 * fVar50 + in_XMM4._8_4_ * fVar24;
        in_XMM14._12_4_ = fVar51 * fVar50 + in_XMM4._12_4_ * fVar24;
        in_XMM1._0_4_ = auVar22._0_4_ * fVar50 + in_XMM6._0_4_ * fVar24;
        in_XMM1._4_4_ = auVar22._4_4_ * fVar50 + in_XMM6._4_4_ * fVar24;
        in_XMM1._8_4_ = auVar22._8_4_ * fVar50 + in_XMM6._8_4_ * fVar24;
        in_XMM1._12_4_ = auVar22._12_4_ * fVar50 + in_XMM6._12_4_ * fVar24;
        in_XMM0._0_4_ = auVar86._0_4_ * fVar50 + in_XMM3._0_4_ * fVar24;
        in_XMM0._4_4_ = auVar86._4_4_ * fVar50 + in_XMM3._4_4_ * fVar24;
        in_XMM0._8_4_ = auVar86._8_4_ * fVar50 + in_XMM3._8_4_ * fVar24;
        in_XMM0._12_4_ = auVar86._12_4_ * fVar50 + in_XMM3._12_4_ * fVar24;
        auVar45._0_4_ = fVar50 * auVar29._0_4_ + fVar24 * auVar54._0_4_;
        auVar45._4_4_ = fVar50 * auVar29._4_4_ + fVar24 * auVar54._4_4_;
        auVar45._8_4_ = fVar50 * auVar29._8_4_ + fVar24 * auVar54._8_4_;
      }
    }
    fVar50 = in_XMM0._0_4_;
    fVar24 = in_XMM0._4_4_;
    fVar25 = in_XMM0._8_4_;
    fVar28 = in_XMM0._12_4_;
    fVar51 = in_XMM1._0_4_;
    fVar62 = in_XMM1._4_4_;
    fVar76 = in_XMM1._8_4_;
    auVar31._0_4_ = fVar51 * fVar24 - fVar50 * fVar62;
    fVar33 = fVar62 * fVar25 - fVar24 * fVar76;
    fVar34 = fVar76 * fVar50 - fVar25 * fVar51;
    auVar36._4_4_ = fVar34;
    auVar36._0_4_ = fVar33;
    auVar36._8_4_ = auVar31._0_4_;
    auVar36._12_4_ = in_XMM1._12_4_ * fVar28 - fVar28 * in_XMM1._12_4_;
    fVar52 = in_XMM14._0_4_;
    fVar68 = in_XMM14._4_4_;
    fVar77 = in_XMM14._8_4_;
    auVar21._0_4_ = fVar50 * fVar68 - fVar24 * fVar52;
    auVar21._4_4_ = fVar24 * fVar77 - fVar25 * fVar68;
    auVar21._8_4_ = fVar25 * fVar52 - fVar50 * fVar77;
    auVar21._12_4_ = fVar28 * in_XMM14._12_4_ - fVar28 * in_XMM14._12_4_;
    fVar50 = fVar76 * fVar68 - fVar77 * fVar62;
    auVar86 = dpps(in_XMM14,auVar36,0x7f);
    auVar27._4_4_ = fVar50;
    auVar27._0_4_ = fVar33;
    auVar22 = insertps(auVar21,auVar21,0x4a);
    auVar31._4_4_ = auVar21._0_4_;
    auVar31._8_4_ = fVar62 * fVar52 - fVar68 * fVar51;
    auVar31._12_4_ = 0;
    auVar27._8_4_ = fVar50;
    auVar27._12_4_ = auVar22._4_4_;
    auVar26._8_8_ = auVar27._8_8_;
    auVar26._4_4_ = auVar22._0_4_;
    auVar26._0_4_ = fVar33;
    auVar37._4_4_ = auVar22._8_4_;
    auVar37._0_4_ = fVar34;
    auVar37._8_4_ = fVar51 * fVar77 - fVar52 * fVar76;
    auVar37._12_4_ = auVar22._12_4_;
    auVar87._0_4_ = auVar86._0_4_;
    auVar87._4_4_ = auVar87._0_4_;
    auVar87._8_4_ = auVar87._0_4_;
    auVar87._12_4_ = auVar87._0_4_;
    auVar22 = divps(auVar26,auVar87);
    auVar38 = divps(auVar37,auVar87);
    auVar86 = divps(auVar31,auVar87);
    fVar82 = auVar45._0_4_;
    fVar44 = auVar45._4_4_;
    fVar66 = auVar45._8_4_;
    fVar68 = auVar86._0_4_;
    fVar77 = auVar86._4_4_;
    fVar65 = auVar86._8_4_;
    fVar53 = auVar86._12_4_;
    fVar60 = auVar38._0_4_;
    fVar61 = auVar38._4_4_;
    fVar78 = auVar38._8_4_;
    fVar73 = auVar38._12_4_;
    fVar76 = auVar22._0_4_;
    fVar33 = auVar22._4_4_;
    fVar34 = auVar22._8_4_;
    fVar52 = auVar22._12_4_;
    fVar50 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar24 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar25 = (ray->super_RayK<1>).org.field_0.m128[2];
    auVar45 = *(undefined1 (*) [12])&(ray->super_RayK<1>).org.field_0;
    aVar10 = (ray->super_RayK<1>).org.field_0;
    pVVar1 = &(ray->super_RayK<1>).dir;
    fVar28 = (pVVar1->field_0).m128[0];
    fVar51 = (ray->super_RayK<1>).dir.field_0.m128[1];
    fVar62 = (ray->super_RayK<1>).dir.field_0.m128[2];
    auVar54 = *(undefined1 (*) [12])&pVVar1->field_0;
    aVar11 = pVVar1->field_0;
    auVar41._0_4_ =
         fVar50 * fVar76 +
         fVar24 * fVar60 + (fVar25 * fVar68 - (fVar82 * fVar76 + fVar44 * fVar60 + fVar66 * fVar68))
    ;
    auVar41._4_4_ =
         fVar50 * fVar33 +
         fVar24 * fVar61 + (fVar25 * fVar77 - (fVar82 * fVar33 + fVar44 * fVar61 + fVar66 * fVar77))
    ;
    auVar41._8_4_ =
         fVar50 * fVar34 +
         fVar24 * fVar78 + (fVar25 * fVar65 - (fVar82 * fVar34 + fVar44 * fVar78 + fVar66 * fVar65))
    ;
    auVar41._12_4_ =
         fVar50 * fVar52 +
         fVar24 * fVar73 + (fVar25 * fVar53 - (fVar82 * fVar52 + fVar44 * fVar73 + fVar66 * fVar53))
    ;
    aVar42 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             insertps(auVar41,(ray->super_RayK<1>).org.field_0.m128[3],0x30);
    (ray->super_RayK<1>).org.field_0 = aVar42;
    auVar23._0_4_ = fVar28 * fVar76 + fVar51 * fVar60 + fVar62 * fVar68;
    auVar23._4_4_ = fVar28 * fVar33 + fVar51 * fVar61 + fVar62 * fVar77;
    auVar23._8_4_ = fVar28 * fVar34 + fVar51 * fVar78 + fVar62 * fVar65;
    auVar23._12_4_ = fVar28 * fVar52 + fVar51 * fVar73 + fVar62 * fVar53;
    aVar42 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
             insertps(auVar23,(ray->super_RayK<1>).dir.field_0.m128[3],0x30);
    (ray->super_RayK<1>).dir.field_0 = aVar42;
    (**(code **)(p_Var17 + 0x78))(p_Var17 + 0x58,ray);
    local_188 = auVar45._0_8_;
    uStack_180 = aVar10._8_8_;
    *(undefined1 (*) [8])&(ray->super_RayK<1>).org.field_0 = local_188;
    *(undefined8 *)((long)&(ray->super_RayK<1>).org.field_0 + 8) = uStack_180;
    local_198 = auVar54._0_8_;
    uStack_190 = aVar11._8_8_;
    *(undefined1 (*) [8])&(ray->super_RayK<1>).dir.field_0 = local_198;
    *(undefined8 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8) = uStack_190;
    pRVar6->instID[0] = 0xffffffff;
    pRVar6->instPrimID[0] = 0xffffffff;
  }
  return;
}

Assistant:

void InstanceArrayIntersector1MB::intersect(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      if ((ray.mask & instance->mask) == 0) 
        return;
#endif
      
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, ray.time());
        const Vec3ff ray_org = ray.org;
        const Vec3ff ray_dir = ray.dir;
        ray.org = Vec3ff(xfmPoint(world2local, ray_org), ray.tnear());
        ray.dir = Vec3ff(xfmVector(world2local, ray_dir), ray.time());
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.intersect((RTCRayHit&)ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }